

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall Graph::createList(Graph *this)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int (*paiVar4) [50];
  vector<int,_std::allocator<int>_> *this_00;
  int iVar5;
  ulong uVar6;
  int local_68;
  int local_64;
  vector<int,_std::allocator<int>_> *local_60;
  int (*local_58) [50];
  ulong local_50;
  ulong local_48;
  Graph *local_40;
  int (*local_38) [50];
  
  uVar1 = this->num_of_vert;
  clearList(this);
  local_58 = this->adj_matrix;
  local_60 = this->adj_list;
  local_48 = 0;
  local_50 = 0;
  local_40 = this;
  if (0 < (int)uVar1) {
    local_50 = (ulong)uVar1;
  }
  for (; local_48 != local_50; local_48 = local_48 + 1) {
    this_00 = local_60 + local_48;
    local_38 = local_58 + local_48;
    uVar6 = 0;
    paiVar4 = local_38;
    while (uVar6 != uVar1) {
      piVar3 = *paiVar4 + uVar6;
      iVar2 = *piVar3;
      if (iVar2 == 1) {
        local_64 = (int)uVar6 + 1;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_64);
        iVar2 = *piVar3;
      }
      if (iVar2 < 2) {
        uVar6 = uVar6 + 1;
      }
      else {
        local_40->multigraph_status = true;
        local_40->adjoint_status = false;
        local_40->line_status = false;
        uVar6 = uVar6 + 1;
        for (iVar5 = 0; paiVar4 = local_38, iVar5 < iVar2; iVar5 = iVar5 + 1) {
          local_68 = (int)uVar6;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_68);
          iVar2 = *piVar3;
        }
      }
    }
  }
  return;
}

Assistant:

void Graph::createList(){
   int nv = this->num_of_vert;
   this->clearList();
   for(int i = 0; i < nv; i++)
      for(int j = 0; j < nv; j++){
         if(this->adj_matrix[i][j] == 1){
            // pushes index of current column + 1 (current vertex)
            this->adj_list[i].push_back(j + 1);
         }
         // if value is bigger than 1, then G is a multigraph
         if(this->adj_matrix[i][j] > 1){
            this->multigraph_status = true;
            this->adjoint_status = false;
            this->line_status = false;
            for(int k = 0; k < this->adj_matrix[i][j]; k++){
               this->adj_list[i].push_back(j + 1);
            }
         }
      }
   return void();
}